

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xpath_bit_is_set(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,
                    lys_module *param_4,lyxp_set *set,int options)

{
  LYS_NODE LVar1;
  ly_ctx *plVar2;
  lyd_node *plVar3;
  int iVar4;
  lys_node *plVar5;
  char *pcVar6;
  uint local_5c;
  int ret;
  int bits_count;
  int i;
  lys_node_leaf *sleaf;
  lyd_node_leaf_list *leaf;
  int options_local;
  lyxp_set *set_local;
  lys_module *local_mod_local;
  lyd_node *cur_node_local;
  uint16_t UNUSED_arg_count_local;
  lyxp_set **args_local;
  
  if ((options & 0x1cU) == 0) {
    if (((*args)->type == LYXP_SET_NODE_SET) || ((*args)->type == LYXP_SET_EMPTY)) {
      iVar4 = lyxp_set_cast(args[1],LYXP_SET_STRING,cur_node,param_4,options);
      if (iVar4 == 0) {
        set_fill_boolean(set,0);
        if ((((*args)->type == LYXP_SET_NODE_SET) &&
            (plVar3 = (((*args)->val).nodes)->node,
            (plVar3->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN)) &&
           (*(int *)&plVar3->schema[1].ref == 2)) {
          LVar1 = plVar3->schema[1].nodetype;
          for (ret = 0; ret < (int)LVar1; ret = ret + 1) {
            if (((&plVar3->child->schema)[ret] != (lys_node *)0x0) &&
               (iVar4 = ly_strequal_((&plVar3->child->schema)[ret]->name,(args[1]->val).str),
               iVar4 != 0)) {
              set_fill_boolean(set,1);
              break;
            }
          }
        }
        args_local._4_4_ = 0;
      }
      else {
        args_local._4_4_ = 0xffffffff;
      }
    }
    else {
      plVar2 = param_4->ctx;
      pcVar6 = print_set_type(*args);
      ly_vlog(plVar2,LYE_XPATH_INARGTYPE,LY_VLOG_NONE,(void *)0x0,1,pcVar6,
              "bit-is-set(node-set, string)");
      args_local._4_4_ = 0xffffffff;
    }
  }
  else {
    if (((*args)->type == LYXP_SET_SNODE_SET) &&
       (plVar5 = warn_get_snode_in_ctx(*args), plVar5 != (lys_node *)0x0)) {
      if ((plVar5->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        plVar2 = param_4->ctx;
        pcVar6 = strnodetype(plVar5->nodetype);
        ly_log(plVar2,LY_LLWRN,LY_SUCCESS,"Argument #1 of %s is a %s node \"%s\".",
               "xpath_bit_is_set",pcVar6,plVar5->name);
        local_5c = 1;
      }
      else {
        iVar4 = warn_is_specific_type((lys_type *)&plVar5[1].ref,LY_TYPE_BITS);
        if (iVar4 == 0) {
          ly_log(param_4->ctx,LY_LLWRN,LY_SUCCESS,
                 "Argument #1 of %s is node \"%s\", not of type \"bits\".","xpath_bit_is_set",
                 plVar5->name);
        }
        local_5c = (uint)(iVar4 == 0);
      }
    }
    else {
      ly_log(param_4->ctx,LY_LLWRN,LY_SUCCESS,"Argument #1 of %s not a node-set as expected.",
             "xpath_bit_is_set");
      local_5c = 1;
    }
    if ((args[1]->type == LYXP_SET_SNODE_SET) &&
       (plVar5 = warn_get_snode_in_ctx(args[1]), plVar5 != (lys_node *)0x0)) {
      if ((plVar5->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        plVar2 = param_4->ctx;
        pcVar6 = strnodetype(plVar5->nodetype);
        ly_log(plVar2,LY_LLWRN,LY_SUCCESS,"Argument #2 of %s is a %s node \"%s\".",
               "xpath_bit_is_set",pcVar6,plVar5->name);
        local_5c = 1;
      }
      else {
        iVar4 = warn_is_string_type((lys_type *)&plVar5[1].ref);
        if (iVar4 == 0) {
          ly_log(param_4->ctx,LY_LLWRN,LY_SUCCESS,
                 "Argument #2 of %s is node \"%s\", not of string-type.","xpath_bit_is_set",
                 plVar5->name);
          local_5c = 1;
        }
      }
    }
    set_snode_clear_ctx(set);
    args_local._4_4_ = local_5c;
  }
  return args_local._4_4_;
}

Assistant:

static int
xpath_bit_is_set(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node, struct lys_module *local_mod,
                 struct lyxp_set *set, int options)
{
    struct lyd_node_leaf_list *leaf;
    struct lys_node_leaf *sleaf;
    int i, bits_count, ret = EXIT_SUCCESS;

    if (options & LYXP_SNODE_ALL) {
        if ((args[0]->type != LYXP_SET_SNODE_SET) || !(sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[0]))) {
            LOGWRN(local_mod->ctx, "Argument #1 of %s not a node-set as expected.", __func__);
            ret = EXIT_FAILURE;
        } else if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
            LOGWRN(local_mod->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
            ret = EXIT_FAILURE;
        } else if (!warn_is_specific_type(&sleaf->type, LY_TYPE_BITS)) {
            LOGWRN(local_mod->ctx, "Argument #1 of %s is node \"%s\", not of type \"bits\".", __func__, sleaf->name);
            ret = EXIT_FAILURE;
        }

        if ((args[1]->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[1]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #2 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #2 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }
        set_snode_clear_ctx(set);
        return ret;
    }

    if ((args[0]->type != LYXP_SET_NODE_SET) && (args[0]->type != LYXP_SET_EMPTY)) {
        LOGVAL(local_mod->ctx, LYE_XPATH_INARGTYPE, LY_VLOG_NONE, NULL, 1, print_set_type(args[0]), "bit-is-set(node-set, string)");
        return -1;
    }
    if (lyxp_set_cast(args[1], LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }

    set_fill_boolean(set, 0);
    if (args[0]->type == LYXP_SET_NODE_SET) {
        leaf = (struct lyd_node_leaf_list *)args[0]->val.nodes[0].node;
        if ((leaf->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST))
                && (((struct lys_node_leaf *)leaf->schema)->type.base == LY_TYPE_BITS)) {
            bits_count = ((struct lys_node_leaf *)leaf->schema)->type.info.bits.count;
            for (i = 0; i < bits_count; ++i) {
                if (leaf->value.bit[i] && ly_strequal(leaf->value.bit[i]->name, args[1]->val.str, 0)) {
                    set_fill_boolean(set, 1);
                    break;
                }
            }
        }
    }

    return EXIT_SUCCESS;
}